

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O0

void __thiscall WSNTopologyBasedEnergy::SelectLeaderID(WSNTopologyBasedEnergy *this)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  reference pWVar3;
  size_type sVar4;
  size_type sVar5;
  _InputArray local_e0;
  allocator<char> local_c1;
  string local_c0 [48];
  Scalar local_90;
  WSNNode local_70;
  __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> local_38;
  WSNNode *local_30;
  byte local_21;
  int local_20;
  int iStack_1c;
  bool BREAK;
  int j;
  int i;
  iterator it;
  WSNTopologyBasedEnergy *this_local;
  
  it._M_current = (WSNNode *)this;
  __gnu_cxx::__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
  __normal_iterator((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> *
                    )&j);
  iStack_1c = 0;
  do {
    if (4 < iStack_1c) {
      return;
    }
    local_20 = 0;
    local_21 = 0;
    local_30 = (WSNNode *)
               std::vector<WSNNode,_std::allocator<WSNNode>_>::begin
                         (this->LayerLeaderSeq + iStack_1c);
    _j = (iterator)local_30;
    while( true ) {
      local_38._M_current =
           (WSNNode *)
           std::vector<WSNNode,_std::allocator<WSNNode>_>::end(this->LayerLeaderSeq + iStack_1c);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                          *)&j,&local_38);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                operator->((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                            *)&j);
      iVar2 = WSNNode::GetNodeID(this_00);
      if (this->ThresEnergy[iStack_1c] <= this->node[iVar2].energy) {
        pWVar3 = __gnu_cxx::
                 __normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
                 operator*((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>
                            *)&j);
        WSNNode::operator=(this->LayerLeaderNode + iStack_1c,pWVar3);
        iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode + iStack_1c);
        WSNNode::WSNNode(&local_70,this->node + iVar2);
        iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode + iStack_1c);
        WSNNode::NodeColor(&local_90,this->node + iVar2);
        drawCrossNode(this,&this->img,&local_70,&local_90);
        WSNNode::~WSNNode(&local_70);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_c0,"WSN",&local_c1);
        cv::_InputArray::_InputArray(&local_e0,&this->img);
        cv::imshow(local_c0,&local_e0);
        cv::_InputArray::~_InputArray(&local_e0);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator(&local_c1);
        iStack_1c = iStack_1c + 1;
        local_21 = 1;
        break;
      }
      local_20 = local_20 + 1;
      __gnu_cxx::__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_>::
      operator++((__normal_iterator<WSNNode_*,_std::vector<WSNNode,_std::allocator<WSNNode>_>_> *)&j
                 ,0);
    }
    if (((local_21 & 1) == 0) &&
       (sVar4 = (size_type)local_20,
       sVar5 = std::vector<WSNNode,_std::allocator<WSNNode>_>::size
                         (this->LayerLeaderSeq + iStack_1c), sVar4 == sVar5)) {
      this->ThresEnergy[iStack_1c] = (this->ThresEnergy[iStack_1c] * 3.0) / 4.0;
      this->Mark[iStack_1c] = this->Mark[iStack_1c] + 1;
    }
  } while( true );
}

Assistant:

void WSNTopologyBasedEnergy::SelectLeaderID()
{
	vector<WSNNode>::iterator it;
	int i=0;
	while(i<LayerNum)
	{
		int j=0;
		bool   BREAK=false;
		for(it=LayerLeaderSeq[i].begin();it!=LayerLeaderSeq[i].end();it++)
		{
			if(node[it->GetNodeID()].energy>=ThresEnergy[i])
			{
				LayerLeaderNode[i]=*it;
				drawCrossNode(img,node[LayerLeaderNode[i].GetNodeID()],node[LayerLeaderNode[i].GetNodeID()].NodeColor());
				imshow("WSN",img);
				i++;
				BREAK=true;
				break;
			}
			j++;
		}
		if(BREAK) continue;
		if(j==LayerLeaderSeq[i].size())
		{
			ThresEnergy[i]=3*ThresEnergy[i]/4;
			Mark[i]++;
		}

	}
}